

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnDataDrop(SharedValidator *this,Location *loc,Var *segment_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Var local_70;
  
  RVar1 = CheckInstr(this,(Opcode)0xd0,loc);
  Var::Var(&local_70,segment_var);
  RVar2 = CheckDataSegmentIndex(this,&local_70);
  Var::~Var(&local_70);
  if (segment_var->type_ == Index) {
    RVar3 = TypeChecker::OnDataDrop(&this->typechecker_,(segment_var->field_2).index_);
    RVar1.enum_._0_1_ = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
    RVar1.enum_._1_3_ = 0;
    return (Result)RVar1.enum_;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                ,0x3b,"Index wabt::Var::index() const");
}

Assistant:

Result SharedValidator::OnDataDrop(const Location& loc, Var segment_var) {
  Result result = CheckInstr(Opcode::DataDrop, loc);
  result |= CheckDataSegmentIndex(segment_var);
  result |= typechecker_.OnDataDrop(segment_var.index());
  return result;
}